

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O3

ze_result_t driver::zeRTASBuilderDestroyExp(ze_rtas_builder_exp_handle_t hBuilder)

{
  ze_result_t zVar1;
  
  if (DAT_0010e118 != (code *)0x0) {
    zVar1 = (*DAT_0010e118)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeRTASBuilderDestroyExp(
        ze_rtas_builder_exp_handle_t hBuilder           ///< [in][release] handle of builder object to destroy
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnDestroyExp = context.zeDdiTable.RTASBuilderExp.pfnDestroyExp;
        if( nullptr != pfnDestroyExp )
        {
            result = pfnDestroyExp( hBuilder );
        }
        else
        {
            // generic implementation

        }

        return result;
    }